

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::DvpValidateCommittedShaderResources
          (DeviceContextVkImpl *this,ResourceBindInfo *BindInfo)

{
  PipelineStateVkImpl *this_00;
  uint uVar1;
  PipelineResourceSignatureImplType *pPVar2;
  VkDescriptorSetLayout_T *pVVar3;
  VkDescriptorSetLayout_T *pVVar4;
  uint uVar5;
  uint Index;
  Uint32 UVar6;
  uint uVar7;
  string msg;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  if ((BindInfo->super_CommittedShaderResources).ResourcesValidated == false) {
    local_48 = (code *)0x0;
    uStack_40 = 0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifySRBCompatibility
              ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,
               &BindInfo->super_CommittedShaderResources,
               (function<Diligent::PipelineResourceSignatureVkImpl_*(unsigned_int)> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    this_00 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.m_pObject;
    PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
              (&this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    Index = 0;
    uVar1 = (uint)(this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_SignatureCount;
    if (uVar1 != 0) {
      do {
        pPVar2 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
                           (&((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState
                             .m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>,
                            Index);
        if (pPVar2 != (PipelineResourceSignatureImplType *)0x0) {
          pVVar4 = (pPVar2->m_VkDescrSetLayouts)._M_elems[0].m_VkObject;
          pVVar3 = (pPVar2->m_VkDescrSetLayouts)._M_elems[1].m_VkObject;
          if (pVVar4 != (VkDescriptorSetLayout_T *)0x0 || pVVar3 != (VkDescriptorSetLayout_T *)0x0)
          {
            UVar6 = Index;
            if (((BindInfo->super_CommittedShaderResources).StaleSRBMask &
                (BindInfo->super_CommittedShaderResources).ActiveSRBMask) != 0) {
              FormatString<char[57]>
                        (&msg,(char (*) [57])
                              "CommitDescriptorSets() must be called before validation.");
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"DvpValidateCommittedShaderResources",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                         ,499);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              }
              pVVar4 = (pPVar2->m_VkDescrSetLayouts)._M_elems[0].m_VkObject;
              pVVar3 = (pPVar2->m_VkDescrSetLayouts)._M_elems[1].m_VkObject;
              UVar6 = Index;
            }
            uVar7 = 0;
            uVar5 = (uint)(pVVar3 != (VkDescriptorSetLayout_T *)0x0) +
                    (uint)(pVVar4 != (VkDescriptorSetLayout_T *)0x0);
            Index = UVar6;
            if (uVar5 != 0) {
              do {
                if ((BindInfo->SetInfo)._M_elems[UVar6].vkSets._M_elems[uVar7] ==
                    (VkDescriptorSet_T *)0x0) {
                  FormatString<char[27],unsigned_int,char[39],char_const*,char[18],unsigned_int,char[2]>
                            (&msg,(Diligent *)"descriptor set with index ",
                             (char (*) [27])&stack0xffffffffffffff6c,
                             (uint *)" is not bound for resource signature \'",
                             (char (*) [39])
                             &(pPVar2->
                              super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                              super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                              .m_Desc,(char **)"\', binding index ",
                             (char (*) [18])&stack0xffffffffffffff68,(uint *)0x75a69e,
                             (char (*) [2])CONCAT44(uVar7,Index));
                  DebugAssertionFailed
                            (msg._M_dataplus._M_p,"DvpValidateCommittedShaderResources",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                             ,0x1fb);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg._M_dataplus._M_p != &msg.field_2) {
                    operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                  }
                }
                uVar7 = uVar7 + 1;
              } while (uVar7 < uVar5);
            }
            if ((BindInfo->SetInfo)._M_elems[UVar6].LastBoundBaseInd !=
                (BindInfo->SetInfo)._M_elems[UVar6].BaseInd) {
              FormatString<char[34],unsigned_int,char[33],unsigned_int,char[56],unsigned_int,char[77]>
                        (&msg,(Diligent *)"Shader resource binding at index ",
                         (char (*) [34])&stack0xffffffffffffff68,
                         (uint *)" has descriptor set base offset ",
                         (char (*) [33])&(BindInfo->SetInfo)._M_elems[UVar6].BaseInd,
                         (uint *)", but currently bound descriptor sets have base offset ",
                         (char (*) [56])&(BindInfo->SetInfo)._M_elems[UVar6].LastBoundBaseInd,
                         (uint *)
                         "; one of the resource signatures with lower binding index is not compatible."
                         ,(char (*) [77])CONCAT44(uVar7,Index));
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"DvpValidateCommittedShaderResources",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                         ,0x201);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              }
            }
          }
        }
        Index = Index + 1;
      } while (Index < uVar1);
    }
    PipelineStateVkImpl::DvpVerifySRBResources
              ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.m_pObject,this
               ,(ShaderResourceCacheArrayType *)BindInfo);
    (BindInfo->super_CommittedShaderResources).ResourcesValidated = true;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::DvpValidateCommittedShaderResources(ResourceBindInfo& BindInfo)
{
    if (BindInfo.ResourcesValidated)
        return;

    DvpVerifySRBCompatibility(BindInfo);

    const Uint32 SignCount = m_pPipelineState->GetResourceSignatureCount();
    for (Uint32 i = 0; i < SignCount; ++i)
    {
        const PipelineResourceSignatureVkImpl* pSign = m_pPipelineState->GetResourceSignature(i);
        if (pSign == nullptr || pSign->GetNumDescriptorSets() == 0)
            continue; // Skip null and empty signatures

        DEV_CHECK_ERR((BindInfo.StaleSRBMask & BindInfo.ActiveSRBMask) == 0, "CommitDescriptorSets() must be called before validation.");

        const ResourceBindInfo::DescriptorSetInfo& SetInfo = BindInfo.SetInfo[i];
        const Uint32                               DSCount = pSign->GetNumDescriptorSets();
        for (Uint32 s = 0; s < DSCount; ++s)
        {
            DEV_CHECK_ERR(SetInfo.vkSets[s] != VK_NULL_HANDLE,
                          "descriptor set with index ", s, " is not bound for resource signature '",
                          pSign->GetDesc().Name, "', binding index ", i, ".");
        }

        DEV_CHECK_ERR(SetInfo.LastBoundBaseInd == SetInfo.BaseInd,
                      "Shader resource binding at index ", i, " has descriptor set base offset ", SetInfo.BaseInd,
                      ", but currently bound descriptor sets have base offset ", SetInfo.LastBoundBaseInd,
                      "; one of the resource signatures with lower binding index is not compatible.");
    }

    m_pPipelineState->DvpVerifySRBResources(this, BindInfo.ResourceCaches);

    BindInfo.ResourcesValidated = true;
}